

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers_test.cpp
# Opt level: O1

void __thiscall Array2D_Bounds_Test::TestBody(Array2D_Bounds_Test *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  Allocator allocator;
  int iVar4;
  Tuple2<pbrt::Point2,_int> TVar5;
  ulong uVar6;
  char *pcVar7;
  int iVar8;
  Bounds2i b;
  AssertionResult gtest_ar;
  Array2D<pbrt::Point2<float>_> a;
  undefined8 local_80;
  AssertHelper local_78;
  Bounds2i local_70;
  internal local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  Array2D<pbrt::Point2<float>_> local_50;
  
  local_70.pMin.super_Tuple2<pbrt::Point2,_int>.x = -4;
  local_70.pMin.super_Tuple2<pbrt::Point2,_int>.y = 3;
  local_70.pMax.super_Tuple2<pbrt::Point2,_int>.x = 10;
  local_70.pMax.super_Tuple2<pbrt::Point2,_int>.y = 7;
  allocator.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Array2D<pbrt::Point2<float>_>::Array2D(&local_50,&local_70,allocator);
  local_80._0_4_ =
       (float)(local_70.pMax.super_Tuple2<pbrt::Point2,_int>.x -
              local_70.pMin.super_Tuple2<pbrt::Point2,_int>.x);
  local_78.data_._0_4_ =
       local_50.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
       local_50.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  testing::internal::CmpHelperEQ<int,int>
            (local_60,"b.pMax.x - b.pMin.x","a.xSize()",(int *)&local_80,(int *)&local_78);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/containers_test.cpp"
               ,0x25,pcVar7);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_80 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_80 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         )) {
        (**(code **)(*(long *)local_80 + 8))();
      }
      local_80 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80._0_4_ =
       (float)(local_70.pMax.super_Tuple2<pbrt::Point2,_int>.y -
              local_70.pMin.super_Tuple2<pbrt::Point2,_int>.y);
  local_78.data_._0_4_ =
       local_50.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
       local_50.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  testing::internal::CmpHelperEQ<int,int>
            (local_60,"b.pMax.y - b.pMin.y","a.ySize()",(int *)&local_80,(int *)&local_78);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/containers_test.cpp"
               ,0x26,pcVar7);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_80 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_80 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         )) {
        (**(code **)(*(long *)local_80 + 8))();
      }
      local_80 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar2 = local_70.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  uVar6 = (ulong)local_70.pMin.super_Tuple2<pbrt::Point2,_int> >> 0x20;
  TVar5 = local_70.pMin.super_Tuple2<pbrt::Point2,_int>;
  iVar1 = local_70.pMax.super_Tuple2<pbrt::Point2,_int>.y;
  if (local_70.pMax.super_Tuple2<pbrt::Point2,_int>.x <=
      local_70.pMin.super_Tuple2<pbrt::Point2,_int>.x ||
      local_70.pMax.super_Tuple2<pbrt::Point2,_int>.y <=
      local_70.pMin.super_Tuple2<pbrt::Point2,_int>.y) {
    iVar1 = local_70.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  }
  while (iVar1 != (int)uVar6) {
    do {
      iVar4 = TVar5.x;
      iVar8 = (local_50.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
              local_50.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) *
              ((int)uVar6 - local_50.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) +
              (iVar4 - local_50.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x);
      local_50.values[iVar8].super_Tuple2<pbrt::Point2,_float>.x = (float)(int)uVar6;
      local_50.values[iVar8].super_Tuple2<pbrt::Point2,_float>.y = (float)iVar4;
      uVar6 = (ulong)TVar5 & 0xffffffff00000000;
      TVar5 = (Tuple2<pbrt::Point2,_int>)
              (uVar6 + 0x100000000 |
              (ulong)local_70.pMin.super_Tuple2<pbrt::Point2,_int> & 0xffffffff);
      if (iVar4 + 1U != local_70.pMax.super_Tuple2<pbrt::Point2,_int>.x) {
        TVar5 = (Tuple2<pbrt::Point2,_int>)(uVar6 | iVar4 + 1U);
      }
      uVar6 = (ulong)TVar5 >> 0x20;
    } while (local_70.pMin.super_Tuple2<pbrt::Point2,_int>.x != TVar5.x);
  }
  uVar6 = (ulong)local_70.pMin.super_Tuple2<pbrt::Point2,_int> >> 0x20;
  iVar1 = local_70.pMax.super_Tuple2<pbrt::Point2,_int>.y;
  if (local_70.pMax.super_Tuple2<pbrt::Point2,_int>.x <=
      local_70.pMin.super_Tuple2<pbrt::Point2,_int>.x ||
      local_70.pMax.super_Tuple2<pbrt::Point2,_int>.y <=
      local_70.pMin.super_Tuple2<pbrt::Point2,_int>.y) {
    iVar1 = local_70.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  }
  if (iVar1 != local_70.pMin.super_Tuple2<pbrt::Point2,_int>.y) {
    TVar5 = local_70.pMin.super_Tuple2<pbrt::Point2,_int>;
    do {
      iVar4 = TVar5.x;
      local_80._4_4_ = (float)iVar4;
      local_80._0_4_ = (float)(int)uVar6;
      testing::internal::CmpHelperEQ<pbrt::Point2<float>,pbrt::Point2<float>>
                (local_60,"Point2f(p.y, p.x)","a[p]",(Point2<float> *)&local_80,
                 local_50.values +
                 ((local_50.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                  local_50.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) *
                  ((int)uVar6 - local_50.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) +
                 (iVar4 - local_50.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x)));
      if (local_60[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_80);
        pcVar7 = "";
        if (local_58.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = ((local_58.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/containers_test.cpp"
                   ,0x2c,pcVar7);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_80 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (local_80 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_80 + 8))();
          }
          local_80 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar6 = (ulong)TVar5 & 0xffffffff00000000;
      TVar5 = (Tuple2<pbrt::Point2,_int>)
              (uVar6 + 0x100000000 |
              (ulong)local_70.pMin.super_Tuple2<pbrt::Point2,_int> & 0xffffffff);
      if (iVar4 + 1U != local_70.pMax.super_Tuple2<pbrt::Point2,_int>.x) {
        TVar5 = (Tuple2<pbrt::Point2,_int>)(uVar6 | iVar4 + 1U);
      }
      uVar6 = (ulong)TVar5 >> 0x20;
    } while ((iVar2 != TVar5.x) || (iVar1 != TVar5.y));
  }
  pbrt::Array2D<pbrt::Point2<float>_>::~Array2D(&local_50);
  return;
}

Assistant:

TEST(Array2D, Bounds) {
    Bounds2i b(Point2i(-4, 3), Point2i(10, 7));
    Array2D<Point2f> a(b);

    EXPECT_EQ(b.pMax.x - b.pMin.x, a.xSize());
    EXPECT_EQ(b.pMax.y - b.pMin.y, a.ySize());

    for (Point2i p : b)
        a[p] = Point2f(p.y, p.x);

    for (Point2i p : b)
        EXPECT_EQ(Point2f(p.y, p.x), a[p]);
}